

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O2

void apu_square(nesapu_state *info,square_t *chan)

{
  byte bVar1;
  uint32 uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  
  if ((chan->enabled != true) || (chan->Muted == true)) goto LAB_0014f205;
  bVar1 = chan->regs[0];
  uVar3 = bVar1 & 0xf;
  uVar2 = info->sync_times1[uVar3];
  fVar10 = chan->env_phase + -4.0;
  chan->env_phase = fVar10;
LAB_0014f109:
  if (fVar10 < 0.0) {
    fVar10 = fVar10 + (float)(int)uVar2;
    chan->env_phase = fVar10;
    bVar4 = chan->env_vol;
    if ((bVar1 & 0x20) == 0) goto code_r0x0014f11f;
    bVar4 = bVar4 + 1 & 0xf;
    goto LAB_0014f12d;
  }
  iVar5 = chan->vbl_length;
  if (iVar5 < 1) {
LAB_0014f143:
    if (iVar5 == 0) goto LAB_0014f205;
  }
  else if ((bVar1 & 0x20) == 0) {
    iVar5 = iVar5 + -1;
    chan->vbl_length = iVar5;
    goto LAB_0014f143;
  }
  bVar4 = chan->regs[1];
  if ((bVar4 & 7) != 0 && (char)bVar4 < '\0') {
    iVar5 = *(int *)((long)info->sync_times1 + (ulong)(bVar4 >> 2 & 0x1c));
    fVar10 = chan->sweep_phase + -2.0;
    chan->sweep_phase = fVar10;
    while (fVar10 < 0.0) {
      iVar8 = chan->freq >> (bVar4 & 7);
      fVar10 = fVar10 + (float)iVar5;
      chan->sweep_phase = fVar10;
      iVar9 = -iVar8;
      if ((bVar4 & 8) == 0) {
        iVar9 = iVar8;
      }
      chan->freq = iVar9 + chan->freq;
    }
  }
  if ((bVar4 & 8) == 0) {
    bVar7 = 7;
    if ((char)bVar4 < '\0') {
      bVar7 = bVar4 & 7;
    }
    uVar6 = chan->freq;
    if (freq_limit[bVar7] < (int)uVar6 >> 0x10) goto LAB_0014f205;
  }
  else {
    uVar6 = chan->freq;
  }
  if (0x3ffff < (int)uVar6) {
    fVar10 = chan->phaseacc - info->apu_incsize;
    chan->phaseacc = fVar10;
    while (fVar10 < 0.0) {
      fVar10 = fVar10 + (float)(uVar6 >> 0x10);
      chan->phaseacc = fVar10;
      chan->adder = chan->adder + 1 & 0xf;
    }
    if ((bVar1 & 0x10) == 0) {
      uVar3 = (uint)(byte)(0xf - chan->env_vol);
    }
    chan->output = (char)uVar3;
    if (((uint)duty_lut[bVar1 >> 6] >> ((byte)(7 - (chan->adder >> 1)) & 0x1f) & 1) != 0) {
      chan->output = -(char)uVar3;
    }
    return;
  }
LAB_0014f205:
  chan->output = '\0';
  return;
code_r0x0014f11f:
  if (bVar4 < 0xf) {
    bVar4 = bVar4 + 1;
LAB_0014f12d:
    chan->env_vol = bVar4;
  }
  goto LAB_0014f109;
}

Assistant:

static void apu_square(nesapu_state *info, square_t *chan)
{
	int env_delay;
	int sweep_delay;
	uint8 freq_index;

	/* reg0: 0-3=volume, 4=envelope, 5=hold, 6-7=duty cycle
	** reg1: 0-2=sweep shifts, 3=sweep inc/dec, 4-6=sweep length, 7=sweep on
	** reg2: 8 bits of freq
	** reg3: 0-2=high freq, 7-4=vbl length counter
	*/

	if (!chan->enabled || chan->Muted)
	{
		chan->output = 0;
		return;
	}

	/* enveloping */
	env_delay = info->sync_times1[chan->regs[0] & 0x0f];

	/* decay is at a rate of (env_regs + 1) / 240 secs */
	chan->env_phase -= 4;
	while (chan->env_phase < 0)
	{
		chan->env_phase += env_delay;
		if (chan->regs[0] & 0x20)
			chan->env_vol = (chan->env_vol + 1) & 15;
		else if (chan->env_vol < 15)
			chan->env_vol++;
	}

	/* vbl length counter */
	if (chan->vbl_length > 0 && !(chan->regs [0] & 0x20))
		chan->vbl_length--;

	if (!chan->vbl_length)
	{
		chan->output = 0;
		return;
	}

	/* freqsweeps */
	if ((chan->regs[1] & 0x80) && (chan->regs[1] & 7))
	{
		sweep_delay = info->sync_times1[(chan->regs[1] >> 4) & 7];
		chan->sweep_phase -= 2;
		while (chan->sweep_phase < 0)
		{
			chan->sweep_phase += sweep_delay;
			if (chan->regs[1] & 8)
				chan->freq -= chan->freq >> (chan->regs[1] & 7);
			else
				chan->freq += chan->freq >> (chan->regs[1] & 7);
		}
	}

	// Thanks to Delek for the fix
	if (chan->regs[1] & 0x80)
		freq_index = chan->regs[1] & 7;	//If sweeping is enabled, I choose it as normal.
	else
		freq_index = 7;	//If sweeping is disabled, I choose the lower limit.
	//if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[chan->regs[1] & 7])	// original
	if ((!(chan->regs[1] & 8) && (chan->freq >> 16) > freq_limit[freq_index])	// fixed
		 || (chan->freq >> 16) < 4)
	{
		chan->output = 0;
		return;
	}

	chan->phaseacc -= (float) info->apu_incsize; /* # of cycles per sample */

	while (chan->phaseacc < 0)
	{
		chan->phaseacc += (chan->freq >> 16);
		chan->adder = (chan->adder + 1) & 0x0f;
	}

	if (chan->regs[0] & 0x10) /* fixed volume */
		chan->output = chan->regs[0] & 0x0F;
	else
		chan->output = 0x0f - chan->env_vol;

	//BIT( duty_lut[chan->regs[0] >> 6],  7 - BIT(chan->adder, 1, 3) );
	if (duty_lut[chan->regs[0] >> 6] & (1 << (7 - (chan->adder >> 1))))
		chan->output = -chan->output;
}